

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcode.cc
# Opt level: O0

uint32_t __thiscall wabt::Opcode::GetSimdLaneCount(Opcode *this)

{
  Opcode *this_local;
  
  switch(this->enum_) {
  case I8X16ExtractLaneS:
  case I8X16ExtractLaneU:
  case I8X16ReplaceLane:
    this_local._4_4_ = 0x10;
    break;
  default:
    abort();
  case I16X8ExtractLaneS:
  case I16X8ExtractLaneU:
  case I16X8ReplaceLane:
    this_local._4_4_ = 8;
    break;
  case I32X4ExtractLane:
  case I32X4ReplaceLane:
  case F32X4ExtractLane:
  case F32X4ReplaceLane:
    this_local._4_4_ = 4;
    break;
  case I64X2ExtractLane:
  case I64X2ReplaceLane:
  case F64X2ExtractLane:
  case F64X2ReplaceLane:
    this_local._4_4_ = 2;
  }
  return this_local._4_4_;
}

Assistant:

uint32_t Opcode::GetSimdLaneCount() const {
  switch (enum_) {
    case Opcode::I8X16ExtractLaneS:
    case Opcode::I8X16ExtractLaneU:
    case Opcode::I8X16ReplaceLane:
      return 16;
      break;
    case Opcode::I16X8ExtractLaneS:
    case Opcode::I16X8ExtractLaneU:
    case Opcode::I16X8ReplaceLane:
      return 8;
      break;
    case Opcode::F32X4ExtractLane:
    case Opcode::F32X4ReplaceLane:
    case Opcode::I32X4ExtractLane:
    case Opcode::I32X4ReplaceLane:
      return 4;
      break;
    case Opcode::F64X2ExtractLane:
    case Opcode::F64X2ReplaceLane:
    case Opcode::I64X2ExtractLane:
    case Opcode::I64X2ReplaceLane:
      return 2;
      break;
    default:
      WABT_UNREACHABLE;
  }
}